

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  int extraout_EAX;
  uint uVar1;
  int extraout_EAX_00;
  uint64_t a4;
  secp256k1_fe *psVar2;
  secp256k1_fe *psVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  secp256k1_scalar *a;
  uint uVar9;
  secp256k1_fe *psVar10;
  long lVar11;
  long unaff_RBP;
  int iVar12;
  secp256k1_gej *in_RSI;
  ulong uVar13;
  secp256k1_ge *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_fe *psVar16;
  secp256k1_gej *r;
  secp256k1_gej *psVar17;
  secp256k1_gej *psVar18;
  secp256k1_gej *in_R8;
  secp256k1_fe *psVar19;
  secp256k1_fe *psVar20;
  int iVar21;
  secp256k1_fe *psVar22;
  secp256k1_fe *psVar23;
  secp256k1_fe *unaff_R12;
  secp256k1_gej *psVar24;
  secp256k1_fe *unaff_R13;
  secp256k1_fe *unaff_R14;
  secp256k1_fe *psVar25;
  secp256k1_modinv64_modinfo *unaff_R15;
  bool bVar26;
  secp256k1_modinv64_signed62 f;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  uint uStack_630;
  uint uStack_62c;
  secp256k1_gej *psStack_628;
  uint uStack_61c;
  secp256k1_ge *psStack_618;
  secp256k1_ge *psStack_610;
  ulong uStack_608;
  uint uStack_5fc;
  secp256k1_fe sStack_5f8;
  secp256k1_ge sStack_5c8;
  secp256k1_fe sStack_558;
  secp256k1_ge asStack_528 [4];
  secp256k1_ge asStack_388 [4];
  secp256k1_fe *psStack_1e0;
  undefined1 *puStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  code *pcStack_1b8;
  secp256k1_gej sStack_1b0;
  secp256k1_fe *local_118;
  undefined1 local_110 [40];
  secp256k1_fe local_e8;
  secp256k1_fe local_b8;
  secp256k1_modinv64_trans2x2 local_88;
  secp256k1_fe local_68;
  
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  sStack_1b0.z.n[4] = 0x11ba26;
  secp256k1_fe_verify(x);
  local_b8.n[0] = x->n[0];
  local_b8.n[1] = x->n[1];
  local_b8.n[2] = x->n[2];
  local_b8.n[3] = x->n[3];
  local_b8.n[4] = x->n[4];
  local_b8.magnitude = x->magnitude;
  local_b8.normalized = x->normalized;
  psVar10 = &local_b8;
  sStack_1b0.z.n[4] = 0x11ba49;
  secp256k1_fe_normalize_var(psVar10);
  sStack_1b0.z.n[4] = 0x11ba51;
  psVar16 = psVar10;
  secp256k1_fe_verify(psVar10);
  if (local_b8.normalized == 0) {
LAB_0011bff2:
    sStack_1b0.z.n[4] = 0x11bff7;
    secp256k1_fe_is_square_var_cold_19();
LAB_0011bff7:
    sStack_1b0.z.n[4] = 0x11bffc;
    secp256k1_fe_is_square_var_cold_17();
  }
  else {
    if (((local_b8.n[2] == 0 && local_b8.n[3] == 0) && (local_b8.n[1] == 0 && local_b8.n[0] == 0))
        && local_b8.n[4] == 0) {
      psVar10 = (secp256k1_fe *)0x1;
    }
    else {
      local_110._0_8_ = (local_b8.n[1] << 0x34 | local_b8.n[0]) & 0x3fffffffffffffff;
      local_110._8_8_ = (ulong)((uint)local_b8.n[2] & 0xfffff) << 0x2a | local_b8.n[1] >> 10;
      in_R8 = (secp256k1_gej *)
              ((ulong)((uint)local_b8.n[3] & 0x3fffffff) << 0x20 | local_b8.n[2] >> 0x14);
      psVar16 = (secp256k1_fe *)((local_b8.n[4] & 0xffffffffff) << 0x16 | local_b8.n[3] >> 0x1e);
      local_110._32_8_ = local_b8.n[4] >> 0x28;
      local_e8.n[2] = 0;
      local_e8.n[3] = 0;
      local_e8.n[0] = -0x1000003d1;
      local_e8.n[1] = 0;
      local_e8.n[4] = 0x100;
      in_RSI = (secp256k1_gej *)(local_110._8_8_ | local_110._0_8_);
      local_110._16_8_ = in_R8;
      local_110._24_8_ = psVar16;
      if (((local_110._32_8_ == 0 && in_R8 == (secp256k1_gej *)0x0) &&
          in_RSI == (secp256k1_gej *)0x0) && psVar16 == (secp256k1_fe *)0x0) goto LAB_0011bff7;
      unaff_R14 = (secp256k1_fe *)0x5;
      unaff_RBP = -1;
      uVar4 = 0;
      unaff_R13 = (secp256k1_fe *)0xfffffffefffffc2f;
      psVar10 = (secp256k1_fe *)0x0;
      do {
        psVar16 = (secp256k1_fe *)(local_e8.n[1] << 0x3e | (ulong)unaff_R13);
        in_R8 = (secp256k1_gej *)(local_110._8_8_ << 0x3e | local_110._0_8_);
        psVar2 = (secp256k1_fe *)0x0;
        psVar20 = (secp256k1_fe *)0x0;
        unaff_R13 = (secp256k1_fe *)0x1;
        iVar7 = 0x3e;
        psVar25 = (secp256k1_fe *)0x1;
        psVar15 = in_R8;
        psVar22 = psVar16;
        unaff_R12 = psVar10;
        while( true ) {
          uVar13 = -1L << ((byte)iVar7 & 0x3f) | (ulong)psVar15;
          lVar11 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          bVar5 = (byte)lVar11;
          psVar19 = (secp256k1_fe *)((ulong)psVar15 >> (bVar5 & 0x3f));
          psVar25 = (secp256k1_fe *)((long)psVar25 << (bVar5 & 0x3f));
          psVar2 = (secp256k1_fe *)((long)psVar2 << (bVar5 & 0x3f));
          unaff_RBP = unaff_RBP - lVar11;
          in_RSI = (secp256k1_gej *)((ulong)psVar22 >> 2);
          uVar9 = ((uint)((ulong)psVar22 >> 1) ^ (uint)in_RSI) & (uint)lVar11 ^ (uint)unaff_R12;
          psVar10 = (secp256k1_fe *)(ulong)uVar9;
          iVar7 = iVar7 - (uint)lVar11;
          sStack_1b0._144_8_ = uVar4;
          local_118 = unaff_R14;
          if (iVar7 == 0) break;
          if (((ulong)psVar22 & 1) == 0) {
            sStack_1b0.z.n[4] = 0x11bfa7;
            secp256k1_fe_is_square_var_cold_7();
LAB_0011bfa7:
            sStack_1b0.z.n[4] = 0x11bfac;
            secp256k1_fe_is_square_var_cold_6();
LAB_0011bfac:
            sStack_1b0.z.n[4] = 0x11bfb1;
            secp256k1_fe_is_square_var_cold_1();
LAB_0011bfb1:
            sStack_1b0.z.n[4] = 0x11bfb6;
            secp256k1_fe_is_square_var_cold_2();
            goto LAB_0011bfb6;
          }
          if (((ulong)psVar19 & 1) == 0) goto LAB_0011bfa7;
          in_RSI = (secp256k1_gej *)((long)psVar2 * (long)in_R8 + (long)psVar25 * (long)psVar16);
          bVar5 = 0x3e - (char)iVar7;
          unaff_R15 = (secp256k1_modinv64_modinfo *)((long)psVar22 << (bVar5 & 0x3f));
          if (in_RSI != (secp256k1_gej *)unaff_R15) goto LAB_0011bfac;
          unaff_R15 = (secp256k1_modinv64_modinfo *)
                      ((long)unaff_R13 * (long)in_R8 + (long)psVar20 * (long)psVar16);
          in_RSI = (secp256k1_gej *)((long)psVar19 << (bVar5 & 0x3f));
          if ((secp256k1_gej *)unaff_R15 != in_RSI) goto LAB_0011bfb1;
          iVar21 = (int)psVar22;
          iVar12 = (int)psVar19;
          if (unaff_RBP < 0) {
            unaff_RBP = -unaff_RBP;
            iVar6 = (int)unaff_RBP + 1;
            if (iVar7 <= iVar6) {
              iVar6 = iVar7;
            }
            in_RSI = (secp256k1_gej *)(ulong)(iVar6 - 0x3fU);
            if (0xffffffc1 < iVar6 - 0x3fU) {
              psVar10 = (secp256k1_fe *)
                        (ulong)(uVar9 ^ (uint)(((ulong)psVar19 & (ulong)psVar22) >> 1));
              unaff_R15 = (secp256k1_modinv64_modinfo *)
                          ((ulong)(0x3fL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU));
              uVar9 = (iVar12 * iVar12 + 0x3e) * iVar12 * iVar21 & (uint)unaff_R15;
              psVar3 = psVar2;
              psVar2 = unaff_R13;
              in_RSI = (secp256k1_gej *)psVar25;
              psVar23 = psVar22;
              psVar22 = psVar19;
              psVar25 = psVar20;
              goto LAB_0011bcdb;
            }
            goto LAB_0011bfc0;
          }
          iVar6 = (int)unaff_RBP + 1;
          if (iVar7 <= iVar6) {
            iVar6 = iVar7;
          }
          in_RSI = (secp256k1_gej *)(ulong)(iVar6 - 0x3fU);
          if (iVar6 - 0x3fU < 0xffffffc2) goto LAB_0011bfbb;
          unaff_R15 = (secp256k1_modinv64_modinfo *)
                      ((ulong)(0xfL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU));
          uVar9 = -(iVar12 * ((iVar21 * 2 + 2U & 8) + iVar21)) & (uint)unaff_R15;
          psVar3 = unaff_R13;
          in_RSI = (secp256k1_gej *)psVar20;
          psVar23 = psVar19;
LAB_0011bcdb:
          uVar13 = (ulong)uVar9;
          psVar15 = (secp256k1_gej *)((long)psVar23->n + uVar13 * (long)psVar22);
          psVar20 = (secp256k1_fe *)((long)(in_RSI->x).n + (long)psVar25 * uVar13);
          unaff_R13 = (secp256k1_fe *)((long)psVar3->n + uVar13 * (long)psVar2);
          unaff_R12 = psVar10;
          if (((ulong)psVar15 & (ulong)unaff_R15) != 0) {
LAB_0011bfb6:
            sStack_1b0.z.n[4] = 0x11bfbb;
            secp256k1_fe_is_square_var_cold_4();
LAB_0011bfbb:
            sStack_1b0.z.n[4] = 0x11bfc0;
            secp256k1_fe_is_square_var_cold_3();
LAB_0011bfc0:
            sStack_1b0.z.n[4] = 0x11bfc5;
            secp256k1_fe_is_square_var_cold_5();
            goto LAB_0011bfc5;
          }
        }
        psVar16 = (secp256k1_fe *)((long)psVar2 * (long)psVar20);
        lVar11 = (long)psVar25 * (long)unaff_R13 - (long)psVar16;
        uVar4 = (ulong)((secp256k1_fe *)((long)psVar25 * (long)unaff_R13) < psVar16);
        uVar13 = SUB168(SEXT816((long)psVar25) * SEXT816((long)unaff_R13),8) -
                 SUB168(SEXT816((long)psVar2) * SEXT816((long)psVar20),8);
        unaff_R15 = &secp256k1_const_modinfo_fe;
        unaff_R12 = &local_e8;
        local_88.u = (int64_t)psVar25;
        local_88.v = (int64_t)psVar2;
        local_88.q = (int64_t)psVar20;
        local_88.r = (int64_t)unaff_R13;
        if ((lVar11 != 0x4000000000000000 || uVar13 != uVar4) &&
           (uVar13 - uVar4 != -1 || lVar11 != -0x4000000000000000)) {
LAB_0011bfc5:
          sStack_1b0.z.n[4] = 0x11bfca;
          secp256k1_fe_is_square_var_cold_16();
          unaff_R14 = psVar25;
LAB_0011bfca:
          sStack_1b0.z.n[4] = 0x11bfcf;
          secp256k1_fe_is_square_var_cold_15();
LAB_0011bfcf:
          sStack_1b0.z.n[4] = 0x11bfd4;
          secp256k1_fe_is_square_var_cold_14();
LAB_0011bfd4:
          sStack_1b0.z.n[4] = 0x11bfd9;
          secp256k1_fe_is_square_var_cold_13();
LAB_0011bfd9:
          sStack_1b0.z.n[4] = 0x11bfde;
          secp256k1_fe_is_square_var_cold_12();
LAB_0011bfde:
          sStack_1b0.z.n[4] = 0x11bfe3;
          secp256k1_fe_is_square_var_cold_11();
LAB_0011bfe3:
          sStack_1b0.z.n[4] = 0x11bfe8;
          secp256k1_fe_is_square_var_cold_10();
LAB_0011bfe8:
          sStack_1b0.z.n[4] = 0x11bfed;
          secp256k1_fe_is_square_var_cold_9();
LAB_0011bfed:
          sStack_1b0.z.n[4] = 0x11bff2;
          secp256k1_fe_is_square_var_cold_8();
          goto LAB_0011bff2;
        }
        iVar12 = (int)unaff_R14;
        sStack_1b0.z.n[4] = 0x11bd86;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar7 < 1) goto LAB_0011bfca;
        sStack_1b0.z.n[4] = 0x11bda1;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar7) goto LAB_0011bfcf;
        unaff_R13 = (secp256k1_fe *)local_110;
        sStack_1b0.z.n[4] = 0x11bdbe;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R13;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R13,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar7 < 1) goto LAB_0011bfd4;
        sStack_1b0.z.n[4] = 0x11bdd9;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R13;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R13,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar7) goto LAB_0011bfd9;
        sStack_1b0.z.n[4] = 0x11bdf7;
        secp256k1_modinv64_update_fg_62_var
                  (iVar12,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)unaff_R13,&local_88);
        unaff_R13 = (secp256k1_fe *)local_e8.n[0];
        if ((secp256k1_fe *)local_e8.n[0] == (secp256k1_fe *)0x1) {
          if (1 < iVar12) {
            psVar16 = (secp256k1_fe *)0x1;
            uVar4 = 0;
            do {
              uVar4 = uVar4 | local_e8.n[(long)psVar16];
              psVar16 = (secp256k1_fe *)((long)psVar16->n + 1);
            } while (unaff_R14 != psVar16);
            if (uVar4 != 0) goto LAB_0011be2c;
          }
          psVar10 = (secp256k1_fe *)(ulong)(~uVar9 & 1);
          goto LAB_0011bee3;
        }
LAB_0011be2c:
        lVar11 = (long)iVar12;
        if ((-1 < lVar11 + -2 && local_e8.n[lVar11 + -1] == 0) &&
            (&local_118)[lVar11] == (secp256k1_fe *)0x0) {
          unaff_R14 = (secp256k1_fe *)(ulong)(iVar12 - 1);
        }
        sStack_1b0.z.n[4] = 0x11be59;
        iVar12 = (int)unaff_R14;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar7 < 1) goto LAB_0011bfde;
        sStack_1b0.z.n[4] = 0x11be74;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar7) goto LAB_0011bfe3;
        unaff_R12 = (secp256k1_fe *)local_110;
        sStack_1b0.z.n[4] = 0x11be91;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar7 < 1) goto LAB_0011bfe8;
        sStack_1b0.z.n[4] = 0x11beac;
        in_RSI = (secp256k1_gej *)unaff_R14;
        psVar16 = unaff_R12;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar12,
                           &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar7) goto LAB_0011bfed;
        uVar9 = sStack_1b0.infinity + 1;
        uVar4 = (ulong)uVar9;
      } while (uVar9 != 0xc);
      sStack_1b0.z.n[4] = 0x11bed3;
      uVar9 = secp256k1_fe_sqrt(&local_e8,&local_b8);
      psVar10 = (secp256k1_fe *)(ulong)uVar9;
    }
LAB_0011bee3:
    unaff_R14 = &local_68;
    sStack_1b0.z.n[4] = 0x11bef3;
    secp256k1_fe_verify(unaff_R14);
    local_68.n[0] = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
    local_68.n[1] = (local_68.n[0] >> 0x34) + local_68.n[1];
    local_68.n[2] = (local_68.n[1] >> 0x34) + local_68.n[2];
    uVar4 = (local_68.n[2] >> 0x34) + local_68.n[3];
    in_R8 = (secp256k1_gej *)0xfffffffffffff;
    local_68.n[3] = uVar4 & 0xfffffffffffff;
    local_68.n[4] = (uVar4 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
    local_68.n[2] = local_68.n[2] & 0xfffffffffffff;
    local_68.n[1] = local_68.n[1] & 0xfffffffffffff;
    local_68.n[0] = local_68.n[0] & 0xfffffffffffff;
    local_68.magnitude = 1;
    sStack_1b0.z.n[4] = 0x11bf7d;
    secp256k1_fe_verify(unaff_R14);
    psVar16 = &local_b8;
    sStack_1b0.z.n[4] = 0x11bf8a;
    in_RSI = (secp256k1_gej *)unaff_R14;
    iVar7 = secp256k1_fe_sqrt(psVar16,unaff_R14);
    if ((int)psVar10 == iVar7) {
      return (int)psVar10;
    }
  }
  sStack_1b0.z.n[4] = (uint64_t)secp256k1_ge_x_frac_on_curve_var;
  secp256k1_fe_is_square_var_cold_18();
  psVar15 = &sStack_1b0;
  psVar17 = &sStack_1b0;
  psVar18 = &sStack_1b0;
  psVar2 = (secp256k1_fe *)0xfffffffffffff;
  psVar24 = (secp256k1_gej *)0x1000003d0;
  pcStack_1b8 = (code *)0x11c02e;
  sStack_1b0.z.n[1] = (uint64_t)psVar10;
  sStack_1b0.z.n[2] = (uint64_t)unaff_R12;
  sStack_1b0.z.n[3] = (uint64_t)unaff_R14;
  sStack_1b0.z.n[4] = (uint64_t)unaff_R15;
  secp256k1_fe_verify(&in_RSI->x);
  uVar4 = ((in_RSI->x).n[4] >> 0x30) * 0x1000003d1 + (in_RSI->x).n[0];
  if (((uVar4 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar4 & 0xfffffffffffff) == 0)) {
    uVar13 = (uVar4 >> 0x34) + (in_RSI->x).n[1];
    psVar14 = (secp256k1_ge *)((uVar13 >> 0x34) + (in_RSI->x).n[2]);
    r = (secp256k1_gej *)(((ulong)psVar14 >> 0x34) + (in_RSI->x).n[3]);
    in_R8 = (secp256k1_gej *)(((ulong)r >> 0x34) + ((in_RSI->x).n[4] & 0xffffffffffff));
    if ((((uVar13 | uVar4 | (ulong)psVar14 | (ulong)r) & 0xfffffffffffff) != 0 ||
         in_R8 != (secp256k1_gej *)0x0) &&
       (in_R8 = (secp256k1_gej *)((ulong)in_R8 ^ 0xf000000000000),
       ((uVar4 | 0x1000003d0) & uVar13 & (ulong)psVar14 & (ulong)r & (ulong)in_R8) !=
       0xfffffffffffff)) goto LAB_0011c0d4;
    pcStack_1b8 = (code *)0x11c1db;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
    psVar15 = (secp256k1_gej *)psVar14;
  }
  else {
LAB_0011c0d4:
    psVar2 = &sStack_1b0.y;
    pcStack_1b8 = (code *)0x11c0e7;
    secp256k1_fe_mul(psVar2,&in_RSI->x,psVar16);
    pcStack_1b8 = (code *)0x11c0f5;
    secp256k1_fe_sqr(&sStack_1b0.x,psVar16);
    pcStack_1b8 = (code *)0x11c103;
    secp256k1_fe_mul(psVar2,psVar2,&sStack_1b0.x);
    pcStack_1b8 = (code *)0x11c10e;
    secp256k1_fe_sqr(&sStack_1b0.x,&in_RSI->x);
    pcStack_1b8 = (code *)0x11c119;
    secp256k1_fe_sqr(&sStack_1b0.x,&sStack_1b0.x);
    pcStack_1b8 = (code *)0x11c121;
    secp256k1_fe_verify(&sStack_1b0.x);
    r = psVar17;
    psVar24 = &sStack_1b0;
    if (sStack_1b0.x.magnitude < 0x11) {
      sStack_1b0.x.n[0] = sStack_1b0.x.n[0] * 2;
      sStack_1b0.x.n[1] = sStack_1b0.x.n[1] * 2;
      sStack_1b0.x.n[2] = sStack_1b0.x.n[2] * 2;
      sStack_1b0.x.n[3] = sStack_1b0.x.n[3] * 2;
      sStack_1b0.x.n[4] = sStack_1b0.x.n[4] << 1;
      sStack_1b0.x.magnitude = sStack_1b0.x.magnitude * 2;
      sStack_1b0.x.normalized = 0;
      pcStack_1b8 = (code *)0x11c164;
      secp256k1_fe_verify(&sStack_1b0.x);
      psVar16 = &sStack_1b0.y;
      pcStack_1b8 = (code *)0x11c171;
      secp256k1_fe_verify(psVar16);
      pcStack_1b8 = (code *)0x11c179;
      secp256k1_fe_verify(&sStack_1b0.x);
      sStack_1b0.y.magnitude = sStack_1b0.x.magnitude + sStack_1b0.y.magnitude;
      in_RSI = &sStack_1b0;
      r = psVar18;
      psVar24 = &sStack_1b0;
      if (sStack_1b0.y.magnitude < 0x21) {
        sStack_1b0.y.n[0] = sStack_1b0.y.n[0] + sStack_1b0.x.n[0];
        sStack_1b0.y.n[1] = sStack_1b0.y.n[1] + sStack_1b0.x.n[1];
        sStack_1b0.y.n[2] = sStack_1b0.y.n[2] + sStack_1b0.x.n[2];
        sStack_1b0.y.n[3] = sStack_1b0.y.n[3] + sStack_1b0.x.n[3];
        sStack_1b0.y.n[4] = sStack_1b0.y.n[4] + sStack_1b0.x.n[4];
        sStack_1b0.y.normalized = 0;
        pcStack_1b8 = (code *)0x11c1c2;
        secp256k1_fe_verify(&sStack_1b0.y);
        pcStack_1b8 = (code *)0x11c1ca;
        iVar7 = secp256k1_fe_is_square_var(&sStack_1b0.y);
        return iVar7;
      }
      goto LAB_0011c1e0;
    }
  }
  pcStack_1b8 = (code *)0x11c1e0;
  secp256k1_ge_x_frac_on_curve_var_cold_3();
LAB_0011c1e0:
  pcStack_1b8 = secp256k1_ecmult_const;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_1e0 = &in_RSI->x;
  puStack_1d8 = (undefined1 *)psVar24;
  psStack_1d0 = unaff_R13;
  psStack_1c8 = psVar16;
  psStack_1c0 = psVar2;
  pcStack_1b8 = (code *)unaff_RBP;
  secp256k1_ge_verify((secp256k1_ge *)psVar15);
  if (((secp256k1_ge *)psVar15)->infinity == 0) {
    psStack_628 = r;
    secp256k1_scalar_add(&uStack_5fc,a,&secp256k1_ecmult_const_K);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_5fc);
    uStack_5fc = (-(uStack_5fc & 1) & 0xd) + uStack_5fc >> 1;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_5fc);
    secp256k1_scalar_split_lambda(&uStack_62c,&uStack_630,&uStack_5fc);
    secp256k1_scalar_add(&uStack_62c,&uStack_62c,&secp256k1_ecmult_const::S_OFFSET);
    secp256k1_scalar_add(&uStack_630,&uStack_630,&secp256k1_ecmult_const::S_OFFSET);
    iVar7 = 0x7f;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_62c);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_630);
      psVar24 = psStack_628;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    secp256k1_gej_set_ge(psStack_628,(secp256k1_ge *)psVar15);
    secp256k1_ecmult_odd_multiples_table((int)asStack_388,asStack_528,&sStack_558,&psVar24->x,in_R8)
    ;
    psStack_618 = asStack_528;
    psStack_610 = asStack_388;
    secp256k1_ge_table_set_globalz(4,asStack_388,&asStack_528[0].x);
    lVar11 = 0;
    do {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)((long)asStack_528[0].x.n + lVar11),
                 (secp256k1_ge *)((long)asStack_388[0].x.n + lVar11));
      lVar11 = lVar11 + 0x68;
    } while (lVar11 != 0x1a0);
    psVar10 = &sStack_5c8.y;
    psStack_610 = (secp256k1_ge *)&psStack_610[1].y;
    psStack_618 = (secp256k1_ge *)&psStack_618[1].y;
    uVar4 = 0x2a;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_62c);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_62c);
      bVar5 = (char)uVar4 * '\x03';
      uVar9 = uStack_62c >> (bVar5 & 0x1f) & 7;
      if (10 < (uint)uVar4) {
        uVar9 = 0;
      }
      uStack_608 = uVar4;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_630);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_630);
      uStack_61c = uStack_630 >> (bVar5 & 0x1f) & 7;
      uVar1 = uVar9 >> 2 ^ 1;
      sStack_5c8.x.n[4] = asStack_388[0].x.n[4];
      sStack_5c8.x.magnitude = asStack_388[0].x.magnitude;
      sStack_5c8.x.normalized = asStack_388[0].x.normalized;
      sStack_5c8.x.n[2] = asStack_388[0].x.n[2];
      sStack_5c8.x.n[3] = asStack_388[0].x.n[3];
      sStack_5c8.x.n[0] = asStack_388[0].x.n[0];
      sStack_5c8.x.n[1] = asStack_388[0].x.n[1];
      sStack_5c8.y.n[4] = asStack_388[0].y.n[4];
      sStack_5c8.y.magnitude = asStack_388[0].y.magnitude;
      sStack_5c8.y.normalized = asStack_388[0].y.normalized;
      sStack_5c8.y.n[2] = asStack_388[0].y.n[2];
      sStack_5c8.y.n[3] = asStack_388[0].y.n[3];
      sStack_5c8.y.n[0] = asStack_388[0].y.n[0];
      sStack_5c8.y.n[1] = asStack_388[0].y.n[1];
      uVar4 = 1;
      psVar14 = psStack_610;
      do {
        bVar26 = ((-uVar1 ^ uVar9) & 3) == uVar4;
        secp256k1_fe_cmov(&sStack_5c8.x,(secp256k1_fe *)((long)psVar14 + -0x30),(uint)bVar26);
        secp256k1_fe_cmov(psVar10,&psVar14->x,(uint)bVar26);
        uVar4 = uVar4 + 1;
        psVar14 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar14 + 0x60))->n + 1);
      } while (uVar4 != 4);
      uVar8 = (uint)uStack_608;
      uVar9 = uStack_61c;
      if (10 < uVar8) {
        uVar9 = 0;
      }
      sStack_5c8.infinity = 0;
      secp256k1_fe_verify(psVar10);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_5c8.y._40_8_ & 0xffffffff),1);
      sStack_5f8.n[0] = 0x3ffffbfffff0bc - sStack_5c8.y.n[0];
      sStack_5f8.n[1] = 0x3ffffffffffffc - sStack_5c8.y.n[1];
      sStack_5f8.n[2] = 0x3ffffffffffffc - sStack_5c8.y.n[2];
      sStack_5f8.n[3] = 0x3ffffffffffffc - sStack_5c8.y.n[3];
      sStack_5f8.n[4] = 0x3fffffffffffc - sStack_5c8.y.n[4];
      sStack_5f8.magnitude = 2;
      sStack_5f8.normalized = 0;
      secp256k1_fe_verify(&sStack_5f8);
      secp256k1_fe_cmov(psVar10,&sStack_5f8,uVar1);
      psVar15 = psStack_628;
      if (uVar8 == 0x2a) {
        secp256k1_gej_set_ge(psStack_628,&sStack_5c8);
      }
      else {
        iVar7 = 3;
        do {
          secp256k1_gej_double(psVar15,psVar15);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        secp256k1_gej_add_ge(psVar15,psVar15,&sStack_5c8);
      }
      uVar1 = uVar9 >> 2 ^ 1;
      sStack_5c8.x.n[4] = asStack_528[0].x.n[4];
      sStack_5c8.x.magnitude = asStack_528[0].x.magnitude;
      sStack_5c8.x.normalized = asStack_528[0].x.normalized;
      sStack_5c8.x.n[2] = asStack_528[0].x.n[2];
      sStack_5c8.x.n[3] = asStack_528[0].x.n[3];
      sStack_5c8.x.n[0] = asStack_528[0].x.n[0];
      sStack_5c8.x.n[1] = asStack_528[0].x.n[1];
      sStack_5c8.y.n[0] = asStack_528[0].y.n[0];
      sStack_5c8.y.n[1] = asStack_528[0].y.n[1];
      sStack_5c8.y.n[4] = asStack_528[0].y.n[4];
      sStack_5c8.y.magnitude = asStack_528[0].y.magnitude;
      sStack_5c8.y.normalized = asStack_528[0].y.normalized;
      sStack_5c8.y.n[2] = asStack_528[0].y.n[2];
      sStack_5c8.y.n[3] = asStack_528[0].y.n[3];
      uVar4 = 1;
      psVar14 = psStack_618;
      do {
        uVar8 = (uint)(((-uVar1 ^ uVar9) & 3) == uVar4);
        secp256k1_fe_cmov(&sStack_5c8.x,(secp256k1_fe *)((long)psVar14 + -0x30),uVar8);
        secp256k1_fe_cmov(psVar10,&psVar14->x,uVar8);
        uVar4 = uVar4 + 1;
        psVar14 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar14 + 0x60))->n + 1);
      } while (uVar4 != 4);
      sStack_5c8.infinity = 0;
      secp256k1_fe_verify(psVar10);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_5c8.y._40_8_ & 0xffffffff),1);
      sStack_5f8.n[0] = 0x3ffffbfffff0bc - sStack_5c8.y.n[0];
      sStack_5f8.n[1] = 0x3ffffffffffffc - sStack_5c8.y.n[1];
      sStack_5f8.n[2] = 0x3ffffffffffffc - sStack_5c8.y.n[2];
      sStack_5f8.n[3] = 0x3ffffffffffffc - sStack_5c8.y.n[3];
      sStack_5f8.n[4] = 0x3fffffffffffc - sStack_5c8.y.n[4];
      sStack_5f8.magnitude = 2;
      sStack_5f8.normalized = 0;
      secp256k1_fe_verify(&sStack_5f8);
      secp256k1_fe_cmov(psVar10,&sStack_5f8,uVar1);
      psVar15 = psStack_628;
      secp256k1_gej_add_ge(psStack_628,psStack_628,&sStack_5c8);
      uVar4 = (ulong)((int)uStack_608 - 1);
    } while ((int)uStack_608 != 0);
    secp256k1_fe_mul(&psVar15->z,&psVar15->z,&sStack_558);
    return extraout_EAX_00;
  }
  secp256k1_gej_set_infinity(r);
  return extraout_EAX;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}